

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radio.cpp
# Opt level: O1

void __thiscall
zmq::radio_t::xattach_pipe
          (radio_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  pointer *ppppVar1;
  iterator __position;
  pipe_t *local_18;
  
  local_18 = pipe_;
  if (pipe_ == (pipe_t *)0x0) {
    xattach_pipe();
  }
  pipe_t::set_nodelay(local_18);
  dist_t::attach(&this->_dist,local_18);
  if (subscribe_to_all_) {
    __position._M_current =
         (this->_udp_pipes).super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->_udp_pipes).super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<zmq::pipe_t*,std::allocator<zmq::pipe_t*>>::_M_realloc_insert<zmq::pipe_t*const&>
                ((vector<zmq::pipe_t*,std::allocator<zmq::pipe_t*>> *)&this->_udp_pipes,__position,
                 &local_18);
    }
    else {
      *__position._M_current = local_18;
      ppppVar1 = &(this->_udp_pipes).
                  super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *ppppVar1 = *ppppVar1 + 1;
    }
    return;
  }
  xread_activated(this,local_18);
  return;
}

Assistant:

void zmq::radio_t::xattach_pipe (pipe_t *pipe_,
                                 bool subscribe_to_all_,
                                 bool locally_initiated_)
{
    LIBZMQ_UNUSED (subscribe_to_all_);
    LIBZMQ_UNUSED (locally_initiated_);

    zmq_assert (pipe_);

    //  Don't delay pipe termination as there is no one
    //  to receive the delimiter.
    pipe_->set_nodelay ();

    _dist.attach (pipe_);

    if (subscribe_to_all_)
        _udp_pipes.push_back (pipe_);
    //  The pipe is active when attached. Let's read the subscriptions from
    //  it, if any.
    else
        xread_activated (pipe_);
}